

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

double __thiscall ON_PlaneEquation::ZeroTolerance(ON_PlaneEquation *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  ON_3dVector Y;
  ON_3dVector N;
  ON_3dVector X;
  ON_3dPoint P;
  ON_3dVector local_160;
  ON_3dVector local_148;
  ON_3dVector local_130;
  ON_3dPoint local_118;
  ON_3dPoint local_100;
  ON_3dPoint local_e8;
  ON_3dPoint local_d0;
  ON_3dPoint local_b8;
  ON_3dPoint local_a0;
  ON_3dPoint local_88;
  ON_3dPoint local_70;
  ON_3dVector local_58;
  ON_3dPoint local_40;
  
  ON_3dVector::ON_3dVector(&local_130,this->x,this->y,this->z);
  bVar7 = ON_3dVector::Unitize(&local_130);
  dVar2 = 0.0;
  if ((bVar7) && (dVar2 = 0.0, ABS(this->d) < 1.23432101234321e+308)) {
    dVar2 = -this->d;
    ON_3dPoint::ON_3dPoint(&local_40,local_130.x * dVar2,local_130.y * dVar2,dVar2 * local_130.z);
    dVar6 = local_40.z;
    dVar5 = local_40.y;
    dVar4 = local_40.x;
    dVar2 = this->x;
    dVar8 = this->y;
    dVar9 = this->z;
    dVar1 = this->d;
    ON_3dVector::PerpendicularTo(&local_58,&local_130);
    ON_3dVector::Unitize(&local_58);
    ON_3dPoint::ON_3dPoint(&local_118,dVar4 + local_58.x,dVar5 + local_58.y,dVar6 + local_58.z);
    dVar3 = ABS(this->d + local_118.z * this->z + local_118.x * this->x + this->y * local_118.y);
    dVar2 = ABS(dVar1 + dVar6 * dVar9 + dVar4 * dVar2 + dVar5 * dVar8);
    if (dVar3 <= dVar2) {
      dVar3 = dVar2;
    }
    ON_3dPoint::ON_3dPoint
              (&local_70,local_40.x - local_58.x,local_40.y - local_58.y,local_40.z - local_58.z);
    dVar2 = this->d;
    dVar8 = ABS(this->z * local_70.z + this->x * local_70.x + this->y * local_70.y + dVar2);
    if (dVar8 <= dVar3) {
      dVar8 = dVar3;
    }
    ON_3dVector::ON_3dVector(&local_160,local_58.x * dVar2,local_58.y * dVar2,dVar2 * local_58.z);
    ON_3dPoint::ON_3dPoint
              (&local_88,local_40.x + local_160.x,local_40.y + local_160.y,local_40.z + local_160.z)
    ;
    dVar2 = this->d;
    dVar9 = ABS(this->z * local_88.z + this->x * local_88.x + this->y * local_88.y + dVar2);
    if (dVar9 <= dVar8) {
      dVar9 = dVar8;
    }
    ON_3dVector::ON_3dVector(&local_160,local_58.x * dVar2,local_58.y * dVar2,local_58.z * dVar2);
    ON_3dPoint::ON_3dPoint
              (&local_a0,local_40.x - local_160.x,local_40.y - local_160.y,local_40.z - local_160.z)
    ;
    dVar2 = ABS(this->z * local_a0.z + this->x * local_a0.x + this->y * local_a0.y + this->d);
    if (dVar2 <= dVar9) {
      dVar2 = dVar9;
    }
    ON_CrossProduct(&local_160,&local_130,&local_58);
    ON_3dVector::Unitize(&local_160);
    ON_3dPoint::ON_3dPoint
              (&local_b8,local_40.x + local_160.x,local_40.y + local_160.y,local_40.z + local_160.z)
    ;
    dVar8 = ABS(this->z * local_b8.z + this->x * local_b8.x + this->y * local_b8.y + this->d);
    if (dVar8 <= dVar2) {
      dVar8 = dVar2;
    }
    ON_3dPoint::ON_3dPoint
              (&local_d0,local_40.x - local_160.x,local_40.y - local_160.y,local_40.z - local_160.z)
    ;
    dVar2 = this->d;
    dVar9 = ABS(this->z * local_d0.z + this->x * local_d0.x + this->y * local_d0.y + dVar2);
    if (dVar9 <= dVar8) {
      dVar9 = dVar8;
    }
    ON_3dVector::ON_3dVector(&local_148,local_160.x * dVar2,local_160.y * dVar2,dVar2 * local_160.z)
    ;
    ON_3dPoint::ON_3dPoint
              (&local_e8,local_40.x + local_148.x,local_40.y + local_148.y,local_40.z + local_148.z)
    ;
    dVar2 = this->d;
    dVar8 = ABS(this->z * local_e8.z + this->x * local_e8.x + this->y * local_e8.y + dVar2);
    if (dVar8 <= dVar9) {
      dVar8 = dVar9;
    }
    ON_3dVector::ON_3dVector(&local_148,local_160.x * dVar2,local_160.y * dVar2,dVar2 * local_160.z)
    ;
    ON_3dPoint::ON_3dPoint
              (&local_100,local_40.x - local_148.x,local_40.y - local_148.y,local_40.z - local_148.z
              );
    dVar2 = ABS(this->z * local_100.z + this->x * local_100.x + this->y * local_100.y + this->d);
    if (dVar2 <= dVar8) {
      dVar2 = dVar8;
    }
  }
  return dVar2;
}

Assistant:

double ON_PlaneEquation::ZeroTolerance() const
{
  double zero_tolerance = 0.0;
  ON_3dVector N(x,y,z);
  if ( N.Unitize() && ON_IS_VALID(d) )
  {
    const ON_3dPoint P( -d*N.x, -d*N.y, -d*N.z  );

    zero_tolerance = fabs(ValueAt(P));

    ON_3dVector X;
    X.PerpendicularTo(N);
    X.Unitize();
    
    double t = fabs(ValueAt(P+X));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-X));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P+d*X));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-d*X));
    if ( t > zero_tolerance )
      zero_tolerance = t;

    ON_3dVector Y = ON_CrossProduct(N,X);
    Y.Unitize();

    t = fabs(ValueAt(P+Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P+d*Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-d*Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
  }

  return zero_tolerance;
}